

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::anon_unknown_5::createOpFRemGroup(TestContext *testCtx)

{
  allocator<float> *paVar1;
  value_type vVar2;
  deUint32 seed;
  TestCaseGroup *pTVar3;
  TestNode *pTVar4;
  char *pcVar5;
  reference pvVar6;
  Buffer<float> *pBVar7;
  SpvAsmComputeShaderCase *this;
  double dVar8;
  pointer local_264;
  int local_25c;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_258;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_248;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_238;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ulong local_178;
  size_t ndx;
  undefined1 local_168 [8];
  vector<float,_std::allocator<float>_> outputFloats;
  undefined1 local_148 [8];
  vector<float,_std::allocator<float>_> inputFloats2;
  undefined1 local_128 [8];
  vector<float,_std::allocator<float>_> inputFloats1;
  undefined1 local_108 [4];
  int numElements;
  Random rnd;
  ComputeShaderSpec spec;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opfrem","Test the OpFRem instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spec.verifyIO + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar3
            );
  ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pcVar5 = tcu::TestNode::getName(pTVar4);
  seed = deStringHash(pcVar5);
  de::Random::Random((Random *)local_108,seed);
  inputFloats1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 200;
  inputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&inputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_128,200,
             (value_type_conflict2 *)
             ((long)&inputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&inputFloats2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_148,200,
             (value_type_conflict2 *)
             ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ndx._4_4_ = 0;
  std::allocator<float>::allocator((allocator<float> *)((long)&ndx + 3));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_168,200,
             (value_type_conflict2 *)((long)&ndx + 4),(allocator<float> *)((long)&ndx + 3));
  std::allocator<float>::~allocator((allocator<float> *)((long)&ndx + 3));
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_128,0);
  fillRandomScalars<float>((Random *)local_108,-10000.0,10000.0,pvVar6,200,0);
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_148,0);
  fillRandomScalars<float>((Random *)local_108,-100.0,100.0,pvVar6,200,0);
  for (local_178 = 0; local_178 < 200; local_178 = local_178 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_148,local_178);
    dVar8 = std::fabs((double)(ulong)(uint)*pvVar6);
    if (SUB84(dVar8,0) < 0.001) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_148,local_178);
      *pvVar6 = 8.0;
    }
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_128,local_178);
    vVar2 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_148,local_178);
    dVar8 = std::fmod((double)(ulong)(uint)vVar2,(double)(ulong)(uint)*pvVar6);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_168,local_178);
    *pvVar6 = SUB84(dVar8,0);
  }
  pcVar5 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar5,&local_1f9);
  std::operator+(&local_1d8,&local_1f8,
                 "OpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\nOpDecorate %buf BufferBlock\nOpDecorate %indata1 DescriptorSet 0\nOpDecorate %indata1 Binding 0\nOpDecorate %indata2 DescriptorSet 0\nOpDecorate %indata2 Binding 1\nOpDecorate %outdata DescriptorSet 0\nOpDecorate %outdata Binding 2\nOpDecorate %f32arr ArrayStride 4\nOpMemberDecorate %buf 0 Offset 0\n"
                );
  pcVar5 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,pcVar5,&local_221);
  std::operator+(&local_1b8,&local_1d8,&local_220);
  std::operator+(&local_198,&local_1b8,
                 "%buf        = OpTypeStruct %f32arr\n%bufptr     = OpTypePointer Uniform %buf\n%indata1    = OpVariable %bufptr Uniform\n%indata2    = OpVariable %bufptr Uniform\n%outdata    = OpVariable %bufptr Uniform\n%id        = OpVariable %uvec3ptr Input\n%zero      = OpConstant %i32 0\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc1    = OpAccessChain %f32ptr %indata1 %zero %x\n%inval1    = OpLoad %f32 %inloc1\n%inloc2    = OpAccessChain %f32ptr %indata2 %zero %x\n%inval2    = OpLoad %f32 %inloc2\n%rem       = OpFRem %f32 %inval1 %inval2\n%outloc    = OpAccessChain %f32ptr %outdata %zero %x\n             OpStore %outloc %rem\n             OpReturn\n             OpFunctionEnd\n"
                );
  std::__cxx11::string::operator=((string *)&rnd.m_rnd.z,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pBVar7 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar7,(vector<float,_std::allocator<float>_> *)local_128);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_238,(BufferInterface *)pBVar7);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec.entryPoint.field_2 + 8),&local_238);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_238);
  pBVar7 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar7,(vector<float,_std::allocator<float>_> *)local_148);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_248,(BufferInterface *)pBVar7);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec.entryPoint.field_2 + 8),&local_248);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_248);
  pBVar7 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar7,(vector<float,_std::allocator<float>_> *)local_168);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_258,(BufferInterface *)pBVar7);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)&spec.inputs.
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_258);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_258);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_264,200,1,1);
  spec.numWorkGroups.m_data[0] = local_25c;
  spec.outputs.
  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_264;
  spec.failMessage.field_2._8_8_ = compareFRem;
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  this = (SpvAsmComputeShaderCase *)operator_new(0x140);
  SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
            (this,(TestContext *)
                  group.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data._8_8_,"all","",(ComputeShaderSpec *)&rnd.m_rnd.z,COMPUTE_TEST_USES_NONE);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this);
  pTVar3 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_168);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_148);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_128);
  de::Random::~Random((Random *)local_108);
  ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createOpFRemGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opfrem", "Test the OpFRem instruction"));
	ComputeShaderSpec				spec;
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;
	vector<float>					inputFloats1	(numElements, 0);
	vector<float>					inputFloats2	(numElements, 0);
	vector<float>					outputFloats	(numElements, 0);

	fillRandomScalars(rnd, -10000.f, 10000.f, &inputFloats1[0], numElements);
	fillRandomScalars(rnd, -100.f, 100.f, &inputFloats2[0], numElements);

	for (size_t ndx = 0; ndx < numElements; ++ndx)
	{
		// Guard against divisors near zero.
		if (std::fabs(inputFloats2[ndx]) < 1e-3)
			inputFloats2[ndx] = 8.f;

		// The return value of std::fmod() has the same sign as its first operand, which is how OpFRem spec'd.
		outputFloats[ndx] = std::fmod(inputFloats1[ndx], inputFloats2[ndx]);
	}

	spec.assembly =
		string(getComputeAsmShaderPreamble()) +

		"OpName %main           \"main\"\n"
		"OpName %id             \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		"OpDecorate %buf BufferBlock\n"
		"OpDecorate %indata1 DescriptorSet 0\n"
		"OpDecorate %indata1 Binding 0\n"
		"OpDecorate %indata2 DescriptorSet 0\n"
		"OpDecorate %indata2 Binding 1\n"
		"OpDecorate %outdata DescriptorSet 0\n"
		"OpDecorate %outdata Binding 2\n"
		"OpDecorate %f32arr ArrayStride 4\n"
		"OpMemberDecorate %buf 0 Offset 0\n"

		+ string(getComputeAsmCommonTypes()) +

		"%buf        = OpTypeStruct %f32arr\n"
		"%bufptr     = OpTypePointer Uniform %buf\n"
		"%indata1    = OpVariable %bufptr Uniform\n"
		"%indata2    = OpVariable %bufptr Uniform\n"
		"%outdata    = OpVariable %bufptr Uniform\n"

		"%id        = OpVariable %uvec3ptr Input\n"
		"%zero      = OpConstant %i32 0\n"

		"%main      = OpFunction %void None %voidf\n"
		"%label     = OpLabel\n"
		"%idval     = OpLoad %uvec3 %id\n"
		"%x         = OpCompositeExtract %u32 %idval 0\n"
		"%inloc1    = OpAccessChain %f32ptr %indata1 %zero %x\n"
		"%inval1    = OpLoad %f32 %inloc1\n"
		"%inloc2    = OpAccessChain %f32ptr %indata2 %zero %x\n"
		"%inval2    = OpLoad %f32 %inloc2\n"
		"%rem       = OpFRem %f32 %inval1 %inval2\n"
		"%outloc    = OpAccessChain %f32ptr %outdata %zero %x\n"
		"             OpStore %outloc %rem\n"
		"             OpReturn\n"
		"             OpFunctionEnd\n";

	spec.inputs.push_back(BufferSp(new Float32Buffer(inputFloats1)));
	spec.inputs.push_back(BufferSp(new Float32Buffer(inputFloats2)));
	spec.outputs.push_back(BufferSp(new Float32Buffer(outputFloats)));
	spec.numWorkGroups = IVec3(numElements, 1, 1);
	spec.verifyIO = &compareFRem;

	group->addChild(new SpvAsmComputeShaderCase(testCtx, "all", "", spec));

	return group.release();
}